

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

TypeID __thiscall
spirv_cross::CompilerGLSL::get_composite_member_type
          (CompilerGLSL *this,TypeID type_id,uint32_t member_idx)

{
  bool bVar1;
  uint32_t id;
  SPIRType *type_00;
  TypedID<(spirv_cross::Types)1> *pTVar2;
  CompilerError *this_00;
  SPIRType *type;
  uint32_t member_idx_local;
  CompilerGLSL *this_local;
  TypeID type_id_local;
  
  this_local._0_4_ = type_id.id;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
  type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
  bVar1 = Compiler::is_array(&this->super_Compiler,type_00);
  if (bVar1) {
    this_local._4_4_ = (type_00->parent_type).id;
  }
  else if (type_00->basetype == Struct) {
    pTVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                       (&(type_00->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                        (ulong)member_idx);
    this_local._4_4_ = pTVar2->id;
  }
  else {
    bVar1 = Compiler::is_matrix(&this->super_Compiler,type_00);
    if (bVar1) {
      this_local._4_4_ = (type_00->parent_type).id;
    }
    else {
      bVar1 = Compiler::is_vector(&this->super_Compiler,type_00);
      if (!bVar1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "Shouldn\'t reach lower than vector handling OpSpecConstantOp CompositeInsert!");
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      this_local._4_4_ = (type_00->parent_type).id;
    }
  }
  return (TypeID)this_local._4_4_;
}

Assistant:

TypeID CompilerGLSL::get_composite_member_type(TypeID type_id, uint32_t member_idx)
{
	auto &type = get<SPIRType>(type_id);
	if (is_array(type))
		return type.parent_type;
	if (type.basetype == SPIRType::Struct)
		return type.member_types[member_idx];
	if (is_matrix(type))
		return type.parent_type;
	if (is_vector(type))
		return type.parent_type;
	SPIRV_CROSS_THROW("Shouldn't reach lower than vector handling OpSpecConstantOp CompositeInsert!");
}